

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

uchar * EmergencyFindTable_UuidHelper
                  (bool bReverseByteOrder,size_t sizeof_chunk_value,uchar *buffer,uchar *buffer_end,
                  ON__UINT32 expected_tcode,ON_UUID *expected_uuid)

{
  bool bVar1;
  ON__UINT32 OVar2;
  uchar *puVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  bool bVar13;
  ON_UUID uuid;
  ON__INT64 header_length;
  ON__INT64 chunk_value;
  ON_UUID_struct local_5c;
  uint local_4c;
  ON_UUID_struct *local_48;
  ON__INT64 local_40;
  ulong local_38;
  
  puVar3 = BufferValidateTcode(bReverseByteOrder,buffer,buffer_end,expected_tcode);
  if (puVar3 != (uchar *)0x0) {
    local_38 = 0xffffffffffffffff;
    local_4c = (uint)bReverseByteOrder;
    local_48 = expected_uuid;
    pbVar4 = BufferToChunkValue(bReverseByteOrder,sizeof_chunk_value,puVar3,buffer_end,
                                (ON__INT64 *)&local_38);
    if (-1 < (long)local_38 && pbVar4 != (byte *)0x0) {
      bVar13 = sizeof_chunk_value + 0x31 <= local_38;
      if ((!(bool)(buffer_end <= pbVar4 |
                  local_38 != 0x14 & ~(bVar13 && expected_tcode == 0x20008080))) &&
         (0xf < (long)buffer_end - (long)pbVar4)) {
        pbVar8 = pbVar4 + 4;
        bVar1 = (long)buffer_end - (long)pbVar8 < 2;
        if (bReverseByteOrder) {
          if (bVar1 || buffer_end <= pbVar8) {
            return (uchar *)0x0;
          }
          pbVar7 = pbVar4 + 6;
          if ((long)buffer_end - (long)pbVar7 < 2 || buffer_end <= pbVar7) {
            return (uchar *)0x0;
          }
          bVar9 = pbVar4[3];
          bVar10 = pbVar4[2];
          bVar12 = *pbVar4;
          bVar11 = pbVar4[1];
          pbVar6 = pbVar4 + 7;
          pbVar5 = pbVar8;
          pbVar8 = pbVar4 + 5;
        }
        else {
          if (bVar1 || buffer_end <= pbVar8) {
            return (uchar *)0x0;
          }
          pbVar6 = pbVar4 + 6;
          if ((long)buffer_end - (long)pbVar6 < 2 || buffer_end <= pbVar6) {
            return (uchar *)0x0;
          }
          bVar9 = *pbVar4;
          bVar10 = pbVar4[1];
          bVar11 = pbVar4[2];
          bVar12 = pbVar4[3];
          pbVar5 = pbVar4 + 5;
          pbVar7 = pbVar4 + 7;
        }
        if (7 < (long)buffer_end - (long)(pbVar4 + 8) && pbVar4 + 8 < buffer_end) {
          local_5c.Data1 =
               (uint)bVar9 | (uint)bVar10 << 8 | (uint)bVar11 << 0x10 | (uint)bVar12 << 0x18;
          local_5c.Data2 = CONCAT11(*pbVar5,*pbVar8);
          local_5c.Data3 = CONCAT11(*pbVar7,*pbVar6);
          local_5c.Data4 = *(uchar (*) [8])(pbVar4 + 8);
          if ((local_48 == (ON_UUID_struct *)0x0) ||
             (bVar1 = operator!=(&local_5c,local_48), !bVar1)) {
            pbVar4 = pbVar4 + 0x10;
            if (bVar13 && expected_tcode == 0x20008080) {
              bVar13 = SUB41(local_4c,0);
              puVar3 = BufferValidateTcode(bVar13,pbVar4,buffer_end,0x20008082);
              if (puVar3 == (uchar *)0x0) {
                return (uchar *)0x0;
              }
              local_40 = -1;
              puVar3 = BufferToChunkValue(bVar13,sizeof_chunk_value,puVar3,buffer_end,&local_40);
              if (puVar3 == (uchar *)0x0) {
                return (uchar *)0x0;
              }
              if (local_40 < 0x19) {
                return (uchar *)0x0;
              }
              if (buffer_end <= puVar3 || (long)buffer_end - (long)puVar3 < local_40) {
                return (uchar *)0x0;
              }
              pbVar4 = puVar3 + local_40;
            }
            if (3 < (long)buffer_end - (long)pbVar4 && pbVar4 < buffer_end) {
              pbVar8 = pbVar4 + 2;
              if (bReverseByteOrder) {
                pbVar6 = pbVar8;
                pbVar8 = pbVar4 + 1;
                pbVar7 = pbVar4;
                pbVar5 = pbVar4 + 3;
              }
              else {
                pbVar6 = pbVar4 + 1;
                pbVar7 = pbVar4 + 3;
                pbVar5 = pbVar4;
              }
              bVar9 = *pbVar5;
              bVar10 = *pbVar6;
              bVar12 = *pbVar8;
              bVar11 = *pbVar7;
              OVar2 = ON_CRC32(0,4,&local_5c);
              OVar2 = ON_CRC32(OVar2,2,&local_5c.Data2);
              OVar2 = ON_CRC32(OVar2,2,&local_5c.Data3);
              OVar2 = ON_CRC32(OVar2,8,local_5c.Data4);
              if (CONCAT13(bVar11,CONCAT12(bVar12,CONCAT11(bVar10,bVar9))) == OVar2) {
                return pbVar4 + 4;
              }
              return (uchar *)0x0;
            }
          }
        }
      }
    }
  }
  return (uchar *)0x0;
}

Assistant:

static
const unsigned char* EmergencyFindTable_UuidHelper( 
          bool bReverseByteOrder,
          size_t sizeof_chunk_value, 
          const unsigned char* buffer,
          const unsigned char* buffer_end,
          const ON__UINT32 expected_tcode,
          const ON_UUID* expected_uuid
          )
{
  ON__INT64 chunk_value;
  ON__UINT32 c, cc;
  ON_UUID uuid;

  // make sure the value at the start of the buffer = expected_tcode.
  buffer = BufferValidateTcode(bReverseByteOrder,buffer,buffer_end,expected_tcode);
  if ( 0 == buffer )
    return 0;

  // get length of this chunk containing the uuid
  chunk_value = -1;
  buffer = BufferToChunkValue( bReverseByteOrder,sizeof_chunk_value,buffer,buffer_end,&chunk_value );
  if ( 0 == buffer || chunk_value < 0 )
    return 0;

  // determine how long the chunk is supposed to be and validate the length.
  //
  // The "16+4+sizeof_chunk_value+21+4+4" in the bLookForUserTableRecordHeader
  // breaks down as:
  //  16                       sizeof(uuid)
  //  +4                     + sizeof(TCODE_USER_TABLE_RECORD_HEADER chunk typecode)
  //  +sizeof_chunk_value    + sizeof(TCODE_USER_TABLE_RECORD_HEADER chunk length)
  //  +21                    + major ver, minor ver, bool, archive ver, 3dm ver
  //  +4                     + sizeof(TCODE_USER_TABLE_RECORD_HEADER chunk crc)
  //  +4                     + sizeof(TCODE_USER_TABLE_UUID chunk crc)
  const bool bLookForUserTableRecordHeader = (TCODE_USER_TABLE_UUID == expected_tcode
                                              && ((ON__UINT64)chunk_value) >= (16+4+sizeof_chunk_value+21+4+4)
                                             );
  if ( !bLookForUserTableRecordHeader && 20 != chunk_value )
    return 0;
  buffer = BufferToUuid(bReverseByteOrder,buffer,buffer_end,uuid);
  if ( 0 == buffer )
    return 0;
  if( 0 != expected_uuid && uuid != *expected_uuid )
    return 0;
  
  if ( bLookForUserTableRecordHeader )
  {
    // make sure there is a TCODE_USER_TABLE_RECORD_HEADER chunk and skip over it.
    buffer = BufferValidateTcode(bReverseByteOrder,buffer,buffer_end,TCODE_USER_TABLE_RECORD_HEADER);
    if ( 0 == buffer )
      return 0;
    // get length of the TCODE_USER_TABLE_RECORD_HEADER chunk
    ON__INT64 header_length = -1;
    buffer = BufferToChunkValue( bReverseByteOrder,sizeof_chunk_value,buffer,buffer_end,&header_length );
    if ( 0 == buffer )
      return 0;
    if ( header_length < 25 )
      return 0;
    if ( buffer >= buffer_end || buffer_end - buffer < header_length )
      return 0;
    buffer += header_length;
  }

  buffer = BufferToUINT32(bReverseByteOrder,buffer,buffer_end,&c);
  if ( 0 == buffer )
    return 0;
  cc = ON_CRC32(0,4,&uuid.Data1);
  cc = ON_CRC32(cc,2,&uuid.Data2);
  cc = ON_CRC32(cc,2,&uuid.Data3);
  cc = ON_CRC32(cc,8,&uuid.Data4[0]);
  if ( c != cc )
    return 0;

  return buffer;
}